

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

uint32_t FAudioCreateReverb(FAPO **ppApo,uint32_t Flags)

{
  uint32_t uVar1;
  FAudioReallocFunc in_stack_00000040;
  FAudioFreeFunc in_stack_00000048;
  FAudioMallocFunc in_stack_00000050;
  uint32_t in_stack_0000005c;
  FAPO **in_stack_00000060;
  
  uVar1 = FAudioCreateReverbWithCustomAllocatorEXT
                    (in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                     in_stack_00000040);
  return uVar1;
}

Assistant:

uint32_t FAudioCreateReverb(FAPO** ppApo, uint32_t Flags)
{
	return FAudioCreateReverbWithCustomAllocatorEXT(
		ppApo,
		Flags,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}